

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudio_UnregisterForCallbacks(FAudio *audio,FAudioEngineCallback *pCallback)

{
  FAudioFreeFunc in_RDI;
  FAudioMutex unaff_retaddr;
  
  LinkedList_RemoveEntry((LinkedList **)audio,pCallback,unaff_retaddr,in_RDI);
  return;
}

Assistant:

void FAudio_UnregisterForCallbacks(
	FAudio *audio,
	FAudioEngineCallback *pCallback
) {
	LOG_API_ENTER(audio)
	LinkedList_RemoveEntry(
		&audio->callbacks,
		pCallback,
		audio->callbackLock,
		audio->pFree
	);
	LOG_API_EXIT(audio)
}